

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O2

void init_block(deflate_state *s)

{
  long lVar1;
  
  for (lVar1 = 0x35; lVar1 != 0x153; lVar1 = lVar1 + 1) {
    *(undefined2 *)((long)&s->strm + lVar1 * 4) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x1e; lVar1 = lVar1 + 1) {
    s->dyn_dtree[lVar1].fc.freq = 0;
  }
  for (lVar1 = 0; lVar1 != 0x13; lVar1 = lVar1 + 1) {
    s->bl_tree[lVar1].fc.freq = 0;
  }
  s->dyn_ltree[0x100].fc.freq = 1;
  s->sym_next = 0;
  s->opt_len = 0;
  s->static_len = 0;
  s->matches = 0;
  return;
}

Assistant:

local void init_block(deflate_state *s) {
    int n; /* iterates over tree elements */

    /* Initialize the trees. */
    for (n = 0; n < L_CODES;  n++) s->dyn_ltree[n].Freq = 0;
    for (n = 0; n < D_CODES;  n++) s->dyn_dtree[n].Freq = 0;
    for (n = 0; n < BL_CODES; n++) s->bl_tree[n].Freq = 0;

    s->dyn_ltree[END_BLOCK].Freq = 1;
    s->opt_len = s->static_len = 0L;
    s->sym_next = s->matches = 0;
}